

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean MA_push_stack(Integer datatype,Integer nelem,char *name,Integer *memhandle)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  Integer IVar4;
  long lVar5;
  int maxchars;
  Pointer pcVar6;
  uint uVar7;
  char *__format;
  Pointer pcVar8;
  ulongi B_address;
  AD *ad;
  
  ma_stats.calls[0x17] = ma_stats.calls[0x17] + 1;
  if (ma_trace != 0) {
    printf("MA: pushing \'%s\' (%d)\n",name,nelem & 0xffffffff);
  }
  if (ma_initialized == '\0') {
    sprintf(ma_ebuf,"block \'%s\', MA not yet initialized",name);
  }
  else {
    if (datatype - 1000U < 0x11) {
      if (nelem < 0) {
        __format = "block \'%s\', invalid nelem: %ld";
        pcVar8 = (Pointer)nelem;
      }
      else {
        uVar1 = *(uint *)(datatype * 4 + 0x1d33a0);
        lVar5 = (int)uVar1 * nelem;
        maxchars = (int)((ulong)(ma_sp + (-4 - (*(long *)(datatype * 8 + 0x1d2370) + lVar5))) %
                        (ulong)(long)(int)uVar1);
        pcVar6 = ma_sp + (-4 - ((int)((maxchars >> 0x1f & uVar1) + maxchars) + lVar5));
        if (((0 < ma_numalign) &&
            (uVar7 = ~(-1 << ((byte)ma_numalign & 0x1f)) & (uint)pcVar6, uVar7 != 0)) &&
           (maxchars = (int)((long)(ulong)uVar7 % (long)(int)uVar1), maxchars == 0)) {
          pcVar6 = pcVar6 + -(ulong)uVar7;
        }
        pcVar8 = ma_sp + (((ulong)((uint)pcVar6 & 7) ^ 4) - (long)pcVar6) + 0x54;
        if (pcVar8 <= ma_sp + -(long)ma_hp) {
          ad = (AD *)(ma_sp + -(long)pcVar8);
          ad->datatype = datatype - 1000U;
          ad->nelem = nelem;
          str_ncopy(ad->name,name,maxchars);
          ad->client_space = pcVar6;
          ad->nbytes = (ulongi)pcVar8;
          ad->next = ma_sused;
          ma_sused = ad;
          ad->checksum = (ulongi)(ad->client_space + (long)(pcVar8 + ad->nelem + ad->datatype));
          guard_set(ad);
          ma_stats.sblocks = ma_stats.sblocks + 1;
          uVar2 = ma_stats.sblocks;
          if (ma_stats.sblocks < ma_stats.sblocks_max) {
            uVar2 = ma_stats.sblocks_max;
          }
          ma_stats.sbytes = ma_stats.sbytes + ad->nbytes;
          uVar3 = ma_stats.sbytes;
          if (ma_stats.sbytes < ma_stats.sbytes_max) {
            uVar3 = ma_stats.sbytes_max;
          }
          ma_stats.sblocks_max = uVar2;
          ma_stats.sbytes_max = uVar3;
          ma_sp = (Pointer)ad;
          IVar4 = ma_table_allocate((TableData)ad);
          *memhandle = IVar4;
          return (ulong)(IVar4 != -1);
        }
        __format = "block \'%s\', not enough space to allocate %lu bytes";
      }
    }
    else {
      __format = "block \'%s\', invalid datatype: %ld";
      pcVar8 = (Pointer)datatype;
    }
    sprintf(ma_ebuf,__format,name,pcVar8);
  }
  ma_error(EL_Nonfatal,ET_External,"MA_push_stack",ma_ebuf);
  return 0;
}

Assistant:

public Boolean MA_push_stack(
    Integer    datatype,    /* of elements in this block */
    Integer    nelem,        /* # of elements in this block */
    const char    *name,        /* assigned to this block by client */
    Integer    *memhandle     /* RETURN: handle for this block */)
{
    AR        ar;        /* allocation request */
    AD        *ad;        /* AD for newly allocated block */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */
    Pointer    new_sp;        /* new ma_sp */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_push_stack]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    if (ma_trace) 
    (void)printf("MA: pushing '%s' (%d)\n", name, (int)nelem);

    /* verify initialization */
    if (!ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', MA not yet initialized",
            name);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid datatype: %ld",
            name, (size_t)datatype);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* verify nelem */
    if (nelem < 0)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid nelem: %ld",
            name, (size_t)nelem);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /*
     * attempt to allocate space
     */

    ar.datatype = datatype;
    ar.nelem = nelem;

    balloc_before(&ar, ma_sp, &client_space, &nbytes);

    new_sp = ma_sp - nbytes;
    /* if (new_sp < ma_hp) */
    if (((ulongi)(ma_sp - ma_hp)) < nbytes)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', not enough space to allocate %lu bytes",
            name, nbytes);
        ma_error(EL_Nonfatal, ET_External, "MA_push_stack", ma_ebuf);
        return MA_FALSE;
    }
    else
    {
        ad = (AD *)new_sp;
    }

    /*
     * space has been allocated
     */

    /* initialize the AD */
    ad->datatype = datatype;
    ad->nelem = nelem;
    str_ncopy(ad->name, (char*)name, MA_NAMESIZE);
    ad->client_space = client_space;
    ad->nbytes = nbytes;
    list_insert(ad, &ma_sused);
    ad->checksum = checksum(ad);

    /* set the guards */
    guard_set(ad);

#ifdef DEBUG
    debug_ad_print(ad);
#endif /* DEBUG */

    /* update ma_sp */
    ma_sp = new_sp;

#ifdef STATS
    ma_stats.sblocks++;
    ma_stats.sblocks_max = max(ma_stats.sblocks, ma_stats.sblocks_max);
    ma_stats.sbytes += ad->nbytes;
    ma_stats.sbytes_max = max(ma_stats.sbytes, ma_stats.sbytes_max);
#endif /* STATS */

    /* convert AD to memhandle */
    if ((*memhandle = ma_table_allocate((TableData)ad)) == TABLE_HANDLE_NONE)
        /* failure */
        return MA_FALSE;
    else
        /* success */
        return MA_TRUE;
}